

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
rangeless::fn::impl::to<std::set<int,std::less<int>,std::allocator<int>>>::operator()
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          to<std::set<int,std::less<int>,std::allocator<int>>> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src)

{
  bool bVar1;
  reference this_00;
  iterator __position;
  int *__x;
  X *x;
  iterator __end0;
  iterator __begin0;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *__range4;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src_local;
  to<std::set<int,_std::less<int>,_std::allocator<int>_>_> *this_local;
  
  __end0 = std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::begin(src);
  x = (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end(src);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                                *)&x);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
              ::operator*(&__end0);
    __position = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
    __x = X::operator_cast_to_int_(this_00);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)this,
               (const_iterator)__position._M_node,__x);
    __gnu_cxx::
    __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
    ::operator++(&__end0);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (__return_storage_ptr__,(set<int,_std::less<int>,_std::allocator<int>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Iterable src) && // rvalue-specific because dest will be moved-from
        {
#if 0
            // won't compile with std::set
            dest.insert(dest.end(),
                        std::make_move_iterator(src.begin()),
                        std::make_move_iterator(src.end()));
#else
            for(auto&& x : src) {
                dest.insert(dest.end(), std::move(x));
            }       
#endif
            return std::move(dest);
        }